

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::ContentEncoding::ParseContentEncodingEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long size_00;
  long lVar4;
  long lVar5;
  ulong uVar6;
  void *pvVar7;
  ContentEncoding *this_00;
  longlong lVar8;
  ContentEncoding *in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  ContentEncryption *encryption;
  ContentCompression *compression;
  long status_1;
  longlong size_2;
  longlong id_1;
  long status;
  longlong size_1;
  longlong id;
  longlong encryption_count;
  longlong compression_count;
  longlong stop;
  longlong pos;
  ContentCompression *in_stack_ffffffffffffff10;
  ContentCompression *in_stack_ffffffffffffff18;
  ContentCompression *pCVar9;
  ContentEncryption *in_stack_ffffffffffffff20;
  ContentCompression *in_stack_ffffffffffffff28;
  ContentCompression *in_stack_ffffffffffffff30;
  IMkvReader *in_stack_ffffffffffffff38;
  ContentCompression *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar10;
  ContentCompression *in_stack_ffffffffffffff78;
  long local_70;
  long local_68;
  long local_58;
  long local_50;
  ContentEncryption *encryption_00;
  IMkvReader *pReader_00;
  
  size_00 = in_RSI + in_RDX;
  pReader_00 = (IMkvReader *)0x0;
  encryption_00 = (ContentEncryption *)0x0;
  lVar5 = in_RSI;
  while( true ) {
    if (size_00 <= lVar5) {
      if (((long)pReader_00 < 1) && ((long)encryption_00 < 1)) {
        return -1;
      }
      if (0 < (long)pReader_00) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pReader_00;
        uVar6 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        pvVar7 = operator_new__(uVar6,(nothrow_t *)&std::nothrow);
        *in_RDI = (long)pvVar7;
        if (*in_RDI == 0) {
          return -1;
        }
        in_RDI[1] = *in_RDI;
      }
      if (0 < (long)encryption_00) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = encryption_00;
        uVar6 = SUB168(auVar3 * ZEXT816(8),0);
        if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        pvVar7 = operator_new__(uVar6,(nothrow_t *)&std::nothrow);
        in_RDI[2] = (long)pvVar7;
        if (in_RDI[2] == 0) {
          if ((void *)*in_RDI != (void *)0x0) {
            operator_delete__((void *)*in_RDI);
          }
          *in_RDI = 0;
          return -1;
        }
        in_RDI[3] = in_RDI[2];
      }
      while( true ) {
        if (size_00 <= in_RSI) {
          if (in_RSI != size_00) {
            return -2;
          }
          return 0;
        }
        this_00 = (ContentEncoding *)
                  ParseElementHeader(in_stack_ffffffffffffff38,(longlong *)in_stack_ffffffffffffff30
                                     ,(longlong)in_stack_ffffffffffffff28,
                                     (longlong *)in_stack_ffffffffffffff20,
                                     (longlong *)in_stack_ffffffffffffff18);
        if ((long)this_00 < 0) break;
        if (local_68 == 0x5031) {
          lVar8 = UnserializeUInt(in_stack_ffffffffffffff38,(longlong)in_stack_ffffffffffffff30,
                                  (longlong)in_stack_ffffffffffffff28);
          in_RDI[4] = lVar8;
        }
        else if (local_68 == 0x5032) {
          lVar8 = UnserializeUInt(in_stack_ffffffffffffff38,(longlong)in_stack_ffffffffffffff30,
                                  (longlong)in_stack_ffffffffffffff28);
          in_RDI[5] = lVar8;
          if (in_RDI[5] == 0) {
            return -1;
          }
        }
        else if (local_68 == 0x5033) {
          lVar8 = UnserializeUInt(in_stack_ffffffffffffff38,(longlong)in_stack_ffffffffffffff30,
                                  (longlong)in_stack_ffffffffffffff28);
          in_RDI[6] = lVar8;
        }
        else if (local_68 == 0x5034) {
          in_stack_ffffffffffffff28 =
               (ContentCompression *)operator_new(0x18,(nothrow_t *)&std::nothrow);
          uVar10 = 0;
          in_stack_ffffffffffffff30 = (ContentCompression *)0x0;
          if (in_stack_ffffffffffffff28 != (ContentCompression *)0x0) {
            uVar10 = 1;
            in_stack_ffffffffffffff78 = in_stack_ffffffffffffff28;
            ContentCompression::ContentCompression(in_stack_ffffffffffffff28);
            in_stack_ffffffffffffff30 = in_stack_ffffffffffffff28;
          }
          if (in_stack_ffffffffffffff30 == (ContentCompression *)0x0) {
            return -1;
          }
          pCVar9 = in_stack_ffffffffffffff30;
          lVar5 = ParseCompressionEntry
                            (this_00,(longlong)in_stack_ffffffffffffff30,
                             (longlong)in_stack_ffffffffffffff78,
                             (IMkvReader *)CONCAT17(uVar10,in_stack_ffffffffffffff70),
                             in_stack_ffffffffffffff68);
          if (lVar5 != 0) {
            if (pCVar9 == (ContentCompression *)0x0) {
              return lVar5;
            }
            ContentCompression::~ContentCompression(in_stack_ffffffffffffff10);
            operator_delete(pCVar9);
            return lVar5;
          }
          puVar1 = (undefined8 *)in_RDI[1];
          in_RDI[1] = (long)(puVar1 + 1);
          *puVar1 = pCVar9;
        }
        else if (local_68 == 0x5035) {
          in_stack_ffffffffffffff10 =
               (ContentCompression *)operator_new(0x50,(nothrow_t *)&std::nothrow);
          pCVar9 = (ContentCompression *)0x0;
          if (in_stack_ffffffffffffff10 != (ContentCompression *)0x0) {
            ContentEncryption::ContentEncryption((ContentEncryption *)0x1996a9);
            pCVar9 = in_stack_ffffffffffffff10;
          }
          if (pCVar9 == (ContentCompression *)0x0) {
            return -1;
          }
          in_stack_ffffffffffffff18 = pCVar9;
          lVar5 = ParseEncryptionEntry(in_RCX,in_RSI,size_00,pReader_00,encryption_00);
          if (lVar5 != 0) {
            if (pCVar9 == (ContentCompression *)0x0) {
              return lVar5;
            }
            ContentEncryption::~ContentEncryption(in_stack_ffffffffffffff20);
            operator_delete(pCVar9);
            return lVar5;
          }
          puVar1 = (undefined8 *)in_RDI[3];
          in_RDI[3] = (long)(puVar1 + 1);
          *puVar1 = pCVar9;
        }
        in_RSI = local_70 + in_RSI;
        if (size_00 < in_RSI) {
          return -2;
        }
      }
      return (long)this_00;
    }
    lVar4 = ParseElementHeader(in_stack_ffffffffffffff38,(longlong *)in_stack_ffffffffffffff30,
                               (longlong)in_stack_ffffffffffffff28,
                               (longlong *)in_stack_ffffffffffffff20,
                               (longlong *)in_stack_ffffffffffffff18);
    if (lVar4 < 0) {
      return lVar4;
    }
    if ((local_50 == 0x5034) &&
       (pReader_00 = (IMkvReader *)((long)&pReader_00->_vptr_IMkvReader + 1),
       0x7fffffff < (long)pReader_00)) break;
    if ((local_50 == 0x5035) &&
       (encryption_00 = (ContentEncryption *)((long)&encryption_00->algo + 1),
       0x7fffffff < (long)encryption_00)) {
      return -1;
    }
    lVar5 = local_58 + lVar5;
    if (size_00 < lVar5) {
      return -2;
    }
  }
  return -1;
}

Assistant:

long ContentEncoding::ParseContentEncodingEntry(long long start, long long size,
                                                IMkvReader* pReader) {
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentCompression and ContentEncryption elements.
  long long compression_count = 0;
  long long encryption_count = 0;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompression) {
      ++compression_count;
      if (compression_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    if (id == libwebm::kMkvContentEncryption) {
      ++encryption_count;
      if (encryption_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (compression_count <= 0 && encryption_count <= 0)
    return -1;

  if (compression_count > 0) {
    compression_entries_ = new (std::nothrow)
        ContentCompression*[static_cast<size_t>(compression_count)];
    if (!compression_entries_)
      return -1;
    compression_entries_end_ = compression_entries_;
  }

  if (encryption_count > 0) {
    encryption_entries_ = new (std::nothrow)
        ContentEncryption*[static_cast<size_t>(encryption_count)];
    if (!encryption_entries_) {
      delete[] compression_entries_;
      compression_entries_ = NULL;
      return -1;
    }
    encryption_entries_end_ = encryption_entries_;
  }

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncodingOrder) {
      encoding_order_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncodingScope) {
      encoding_scope_ = UnserializeUInt(pReader, pos, size);
      if (encoding_scope_ < 1)
        return -1;
    } else if (id == libwebm::kMkvContentEncodingType) {
      encoding_type_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentCompression) {
      ContentCompression* const compression =
          new (std::nothrow) ContentCompression();
      if (!compression)
        return -1;

      status = ParseCompressionEntry(pos, size, pReader, compression);
      if (status) {
        delete compression;
        return status;
      }
      assert(compression_count > 0);
      *compression_entries_end_++ = compression;
    } else if (id == libwebm::kMkvContentEncryption) {
      ContentEncryption* const encryption =
          new (std::nothrow) ContentEncryption();
      if (!encryption)
        return -1;

      status = ParseEncryptionEntry(pos, size, pReader, encryption);
      if (status) {
        delete encryption;
        return status;
      }
      assert(encryption_count > 0);
      *encryption_entries_end_++ = encryption;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}